

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# residue.cpp
# Opt level: O2

void Residue::InitPar(char *parFile,string *dir)

{
  long lVar1;
  char *__nptr;
  pointer pbVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  iterator iVar8;
  long lVar9;
  iterator iVar10;
  ostream *poVar11;
  long lVar12;
  long lVar13;
  string (*pasVar14) [30];
  int *piVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  double (*padVar17) [30];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  ulong uVar19;
  pointer piVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  int tmpInt;
  int numLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_580;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strVec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_560;
  double (*local_558) [30];
  int *local_550;
  string tmpStr;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_528;
  ifstream inFile;
  byte abStack_4e0 [488];
  char tempCh [200];
  char tmpLine [500];
  
  std::ifstream::ifstream(&inFile);
  tmpStr._M_dataplus._M_p = (pointer)&tmpStr.field_2;
  tmpStr._M_string_length = 0;
  tmpStr.field_2._M_local_buf[0] = '\0';
  strVec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  strVec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strVec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::open((char *)&inFile,(_Ios_Openmode)parFile);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    strcpy(tempCh,(dir->_M_dataplus)._M_p);
    strcat(tempCh,parFile);
    std::ifstream::open((char *)&inFile,(_Ios_Openmode)tempCh);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      poVar11 = std::operator<<((ostream *)&std::cout,"cannot open parameter file ");
      poVar11 = std::operator<<(poVar11,tempCh);
      std::endl<char,std::char_traits<char>>(poVar11);
LAB_001341f7:
      exit(0);
    }
  }
  std::ios::clear((int)&inFile + (int)*(undefined8 *)(_inFile + -0x18));
  std::istream::seekg((long)&inFile,_S_beg);
  do {
    while( true ) {
      if ((abStack_4e0[*(long *)(_inFile + -0x18)] & 2) != 0) {
        bb_size = 1.93;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&strVec);
        std::__cxx11::string::~string((string *)&tmpStr);
        std::ifstream::~ifstream(&inFile);
        return;
      }
      std::istream::getline((char *)&inFile,(long)tmpLine);
      __isoc99_sscanf(tmpLine,"%*s %s %d",tempCh);
      if (CONCAT17(tempCh[7],
                   CONCAT16(tempCh[6],
                            CONCAT15(tempCh[5],
                                     CONCAT14(tempCh[4],
                                              CONCAT13(tempCh[3],
                                                       CONCAT12(tempCh[2],
                                                                CONCAT11(tempCh[1],tempCh[0])))))))
          == 0x65707974736572) break;
      iVar7 = bcmp(tempCh,"atomDependency",0xf);
      if (iVar7 == 0) {
        local_560 = cType_abi_cxx11_[0];
        local_550 = prev_atom[0][0] + 2;
        for (lVar12 = 0; lVar12 < numLine; lVar12 = lVar12 + 1) {
          std::istream::getline((char *)&inFile,(long)tmpLine);
          std::__cxx11::string::assign((char *)&tmpStr);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&strVec);
          split(&tmpStr,' ',&strVec);
          bVar4 = std::operator!=(strVec.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1,
                                  Name1_abi_cxx11_ + lVar12);
          if (bVar4) {
            poVar11 = std::operator<<((ostream *)&std::cout,"atomDependency error, wrong AA type ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)lVar12);
            poVar11 = std::operator<<(poVar11," ");
            poVar11 = std::operator<<(poVar11,*strVec.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[1].
                                               _M_dataplus._M_p);
            poVar11 = std::operator<<(poVar11," ");
            poVar11 = std::operator<<(poVar11,(string *)(Name1_abi_cxx11_ + lVar12));
            std::endl<char,std::char_traits<char>>(poVar11);
            goto LAB_001341f7;
          }
          tmpInt = 2;
          iVar7 = 2;
          pbVar18 = local_560;
          piVar15 = local_550;
          for (pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              (long)pbVar16 < (long)numAtom[lVar12];
              pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&(((_Vector_base<int,_std::allocator<int>_> *)&pbVar16->_M_dataplus)
                                ->_M_impl).super__Vector_impl_data._M_start + 1)) {
            tmpInt = iVar7 + 1;
            bVar4 = std::operator!=(strVec.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + iVar7,pbVar18);
            pbVar2 = strVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar7 = tmpInt;
            if (bVar4) {
              poVar11 = std::operator<<((ostream *)&std::cout,
                                        "atomDependency error, wrong atom type ");
              poVar11 = std::operator<<(poVar11,(string *)
                                                (strVec.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + tmpInt)
                                       );
              poVar11 = std::operator<<(poVar11," ");
              poVar11 = std::operator<<(poVar11,(string *)pbVar18);
              poVar11 = std::operator<<(poVar11," ");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)lVar12);
              std::endl<char,std::char_traits<char>>(poVar11);
              goto LAB_001341f7;
            }
            lVar9 = (long)tmpInt;
            tmpInt = (int)(lVar9 + 1);
            local_580 = pbVar16;
            iVar5 = atoi(strVec.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_dataplus._M_p);
            pbVar16 = local_580;
            (*(int (*) [3])(piVar15 + -2))[0] = iVar5;
            tmpInt = (int)(lVar9 + 2);
            iVar5 = atoi(pbVar2[lVar9 + 1]._M_dataplus._M_p);
            piVar15[-1] = iVar5;
            iVar7 = iVar7 + 3;
            tmpInt = iVar7;
            iVar5 = atoi(pbVar2[lVar9 + 2]._M_dataplus._M_p);
            *piVar15 = iVar5;
            piVar15 = piVar15 + 3;
            pbVar18 = pbVar18 + 1;
          }
          local_550 = local_550 + 0x5a;
          local_560 = local_560 + 0x1e;
        }
      }
      else {
        iVar7 = bcmp(tempCh,"bondParameter",0xe);
        if (iVar7 == 0) {
          pasVar14 = cType_abi_cxx11_;
          local_580 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      bond_length;
          local_558 = bond_angle;
          for (lVar12 = 0; lVar12 < numLine; lVar12 = lVar12 + 1) {
            std::istream::getline((char *)&inFile,(long)tmpLine);
            std::__cxx11::string::assign((char *)&tmpStr);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&strVec);
            split(&tmpStr,' ',&strVec);
            bVar4 = std::operator!=(strVec.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1,
                                    Name1_abi_cxx11_ + lVar12);
            if (bVar4) {
              poVar11 = std::operator<<((ostream *)&std::cout,"bondParameter error, wrong AA type ")
              ;
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)lVar12);
              poVar11 = std::operator<<(poVar11," ");
              poVar11 = std::operator<<(poVar11,*strVec.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[1].
                                                 _M_dataplus._M_p);
              std::endl<char,std::char_traits<char>>(poVar11);
              goto LAB_001341f7;
            }
            tmpInt = 2;
            iVar7 = 2;
            lVar9 = 0;
            pbVar18 = *pasVar14;
            for (; lVar9 < numAtom[lVar12]; lVar9 = lVar9 + 1) {
              tmpInt = iVar7 + 1;
              bVar4 = std::operator!=(strVec.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + iVar7,pbVar18);
              pbVar2 = strVec.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar7 = tmpInt;
              if (bVar4) {
                poVar11 = std::operator<<((ostream *)&std::cout,
                                          "bondParamter error, wrong atom type ");
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,tmpInt);
                poVar11 = std::operator<<(poVar11," ");
                poVar11 = std::operator<<(poVar11,(string *)
                                                  (strVec.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  (long)tmpInt + -1));
                poVar11 = std::operator<<(poVar11," ");
                poVar11 = std::operator<<(poVar11,(string *)pbVar18);
                std::endl<char,std::char_traits<char>>(poVar11);
                goto LAB_001341f7;
              }
              lVar13 = (long)tmpInt;
              lVar1 = lVar13 + 1;
              tmpInt = (int)lVar1;
              piVar20 = (pointer)atof(strVec.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar13]._M_dataplus.
                                      _M_p);
              (&(((_Vector_base<int,_std::allocator<int>_> *)&local_580->_M_dataplus)->_M_impl).
                super__Vector_impl_data._M_start)[lVar9] = piVar20;
              iVar7 = iVar7 + 2;
              tmpInt = iVar7;
              dVar21 = atof(pbVar2[lVar1]._M_dataplus._M_p);
              (*local_558)[lVar9] = dVar21 * 0.017453292519943278;
              pbVar18 = pbVar18 + 1;
            }
            local_558 = local_558 + 1;
            local_580 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_580[7].field_2;
            pasVar14 = (string (*) [30])((long)pasVar14 + 0x3c0);
          }
        }
        else {
          iVar7 = bcmp(tempCh,"residueSize",0xc);
          if (iVar7 == 0) {
            lVar12 = 0;
            for (lVar9 = 0; lVar9 < numLine; lVar9 = lVar9 + 1) {
              std::istream::getline((char *)&inFile,(long)tmpLine);
              std::__cxx11::string::assign((char *)&tmpStr);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear(&strVec);
              split(&tmpStr,' ',&strVec);
              pbVar2 = strVec.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar21 = atof(strVec.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
              *(double *)((long)size + lVar12) = dVar21;
              dVar21 = atof(pbVar2[4]._M_dataplus._M_p);
              *(double *)((long)sc_size + lVar12) = dVar21;
              lVar12 = lVar12 + 8;
            }
          }
          else {
            iVar7 = bcmp(tempCh,"torsionAngle",0xd);
            if (iVar7 == 0) {
              pasVar14 = cType_abi_cxx11_;
              padVar17 = torsion;
              for (lVar12 = 0; lVar12 < numLine; lVar12 = lVar12 + 1) {
                std::istream::getline((char *)&inFile,(long)tmpLine);
                std::__cxx11::string::assign((char *)&tmpStr);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear(&strVec);
                split(&tmpStr,' ',&strVec);
                tmpInt = 2;
                iVar7 = 2;
                lVar9 = 0;
                local_580 = *pasVar14;
                for (; lVar9 < numAtom[lVar12]; lVar9 = lVar9 + 1) {
                  tmpInt = iVar7 + 1;
                  bVar4 = std::operator!=(strVec.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + iVar7,
                                          *pasVar14);
                  iVar7 = tmpInt;
                  if (bVar4) {
                    poVar11 = std::operator<<((ostream *)&std::cout,
                                              "torsionAngle error, wrong atom type ");
                    poVar11 = std::operator<<(poVar11,(string *)
                                                      (strVec.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  (long)tmpInt + -1));
                    poVar11 = std::operator<<(poVar11," ");
                    poVar11 = std::operator<<(poVar11,(string *)pasVar14);
                    std::endl<char,std::char_traits<char>>(poVar11);
                    goto LAB_001341f7;
                  }
                  __nptr = strVec.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[tmpInt]._M_dataplus._M_p;
                  dVar21 = atof(__nptr);
                  iVar7 = iVar7 + 1;
                  dVar22 = -1234.0;
                  tmpInt = iVar7;
                  if ((dVar21 != -1234.0) || (NAN(dVar21))) {
                    dVar22 = atof(__nptr);
                    dVar22 = dVar22 * 0.017453292519943278;
                  }
                  (*padVar17)[lVar9] = dVar22;
                  pasVar14 = (string (*) [30])((long)pasVar14 + 0x20);
                }
                padVar17 = padVar17 + 1;
                pasVar14 = (string (*) [30])(local_580 + 0x1e);
              }
            }
            else {
              auVar23[0] = -(tempCh[0] == 'f');
              auVar23[1] = -(tempCh[1] == 'u');
              auVar23[2] = -(tempCh[2] == 'n');
              auVar23[3] = -(tempCh[3] == 'c');
              auVar23[4] = -(tempCh[4] == 't');
              auVar23[5] = -(tempCh[5] == 'i');
              auVar23[6] = -(tempCh[6] == 'o');
              auVar23[7] = -(tempCh[7] == 'n');
              auVar23[8] = -(tempCh[8] == 'a');
              auVar23[9] = -(tempCh[9] == 'l');
              auVar23[10] = -(tempCh[10] == 'A');
              auVar23[0xb] = -(tempCh[0xb] == 't');
              auVar23[0xc] = -(tempCh[0xc] == 'o');
              auVar23[0xd] = -(tempCh[0xd] == 'm');
              auVar23[0xe] = -(tempCh[0xe] == 's');
              auVar23[0xf] = -(tempCh[0xf] == '\0');
              if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar23[0xf] >> 7) << 0xf) == 0xffff) {
                for (lVar12 = 0; lVar12 < numLine; lVar12 = lVar12 + 1) {
                  std::istream::getline((char *)&inFile,(long)tmpLine);
                  std::__cxx11::string::assign((char *)&tmpStr);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::clear(&strVec);
                  split(&tmpStr,' ',&strVec);
                  tmpInt = 2;
                  local_580 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (funcAtom + lVar12);
                  lVar9 = 0x40;
                  for (uVar19 = 2;
                      uVar19 < (ulong)((long)strVec.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)strVec.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5);
                      uVar19 = uVar19 + 1) {
                    std::__cxx11::string::_M_assign((string *)&tmpStr);
                    std::operator+(&local_528.first,&tmpStr,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&((strVec.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar9));
                    std::__cxx11::string::operator=((string *)&tmpStr,(string *)&local_528);
                    std::__cxx11::string::~string((string *)&local_528);
                    iVar10 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ::find(&AtomMap_abi_cxx11_._M_t,&tmpStr);
                    if ((_Rb_tree_header *)iVar10._M_node ==
                        &AtomMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                      poVar11 = std::operator<<((ostream *)&std::cout,
                                                "atom type error in reading functional atoms! ");
                      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)lVar12);
                      poVar11 = std::operator<<(poVar11," ");
                      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar19);
                      poVar11 = std::operator<<(poVar11," ");
                      poVar11 = std::operator<<(poVar11,(string *)&tmpStr);
                      std::endl<char,std::char_traits<char>>(poVar11);
                      goto LAB_001341f7;
                    }
                    tmpInt = iVar10._M_node[2]._M_color;
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)local_580,&tmpInt);
                    lVar9 = lVar9 + 0x20;
                  }
                }
              }
            }
          }
        }
      }
    }
    local_560 = cType_abi_cxx11_[0];
    local_558 = (double (*) [30])vdwType;
    iVar7 = 0;
    pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    while ((long)pbVar18 < (long)numLine) {
      local_580 = pbVar18;
      std::istream::getline((char *)&inFile,(long)tmpLine);
      std::__cxx11::string::assign((char *)&tmpStr);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&strVec);
      iVar5 = split(&tmpStr,' ',&strVec);
      pbVar18 = local_580;
      numAtom[(long)local_580] = (iVar5 + -2) / 2;
      std::__cxx11::string::assign((char *)(Name1_abi_cxx11_ + (long)local_580));
      std::__cxx11::string::_M_assign((string *)&tmpStr);
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&AAMap_abi_cxx11_._M_t,&tmpStr);
      if ((_Rb_tree_header *)iVar8._M_node == &AAMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
      {
        poVar11 = std::operator<<((ostream *)&std::cout,"file reading error, wrong AA type ");
        poVar11 = std::operator<<(poVar11,(string *)&tmpStr);
        std::endl<char,std::char_traits<char>>(poVar11);
        goto LAB_001341f7;
      }
      std::__cxx11::string::_M_assign((string *)(Name3_abi_cxx11_ + (long)pbVar18));
      tmpInt = 2;
      pbVar18 = local_560;
      for (lVar12 = 0; iVar5 = (int)lVar12, lVar12 < numAtom[(long)local_580]; lVar12 = lVar12 + 1)
      {
        tmpInt = tmpInt + 1;
        std::__cxx11::string::_M_assign((string *)pbVar18);
        lVar9 = (long)tmpInt;
        tmpInt = tmpInt + 1;
        iVar6 = atoi(strVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_dataplus._M_p);
        *(int *)((long)*local_558 + lVar12 * 4) = iVar6;
        std::__cxx11::string::_M_assign((string *)&tmpStr);
        std::__cxx11::string::append((string *)&tmpStr);
        std::__cxx11::string::string((string *)&local_528,(string *)&tmpStr);
        local_528.second = iVar5;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    *)&AtomMap_abi_cxx11_,&local_528);
        std::__cxx11::string::~string((string *)&local_528);
        std::__cxx11::string::string((string *)&local_528,(string *)&tmpStr);
        local_528.second = iVar7 + iVar5;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    *)&AtomIndexMap_abi_cxx11_,&local_528);
        std::__cxx11::string::~string((string *)&local_528);
        pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)pbVar18 + 0x20);
      }
      local_558 = (double (*) [30])((long)local_558 + 0x78);
      local_560 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)local_560 + 0x3c0);
      iVar7 = iVar7 + iVar5;
      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(((_Vector_base<int,_std::allocator<int>_> *)&local_580->_M_dataplus)->
                        _M_impl).super__Vector_impl_data._M_start + 1);
    }
  } while( true );
}

Assistant:

void Residue::InitPar(char *parFile, string &dir) {
    int i, j, tmpInt, numLine;
    ifstream inFile;
    string tmpStr;
    char tempCh[200], tmpLine[500];
    vector<string> strVec;       // used in reading files
    SSMAP::iterator aaItr;
    SIMAP::iterator siItr;

    inFile.open(parFile, ios::in);
    if (!inFile.is_open()) {
        strcpy(tempCh, dir.c_str());
        strcat(tempCh, parFile);
        inFile.open(tempCh, ios::in);
        if (!inFile.is_open()) {
            cout << "cannot open parameter file " << tempCh << endl;
            exit(0);
        }
    }

    // read parameters
    inFile.clear();
    inFile.seekg(0, ios::beg);
    while (!inFile.eof()) {
        inFile.getline(tmpLine, 1000);
        sscanf(tmpLine, "%*s %s %d", tempCh, &numLine);
        if (strcmp(tempCh, "restype") == 0) { // read residue types
            int AtomIndex = 0;
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                Residue::numAtom[i] = (split(tmpStr, ' ', strVec) - 2) / 2;
                Name1[i] = strVec[0].c_str();
                tmpStr = Name1[i];
                if ((aaItr = AAMap.find(tmpStr)) == AAMap.end()) {
                    cout << "file reading error, wrong AA type " << tmpStr << endl;
                    exit(0);
                }
                else {
                    Name3[i] = aaItr->second;
                }
                tmpInt = 2;
                for (j = 0; j < Residue::numAtom[i]; ++j) {
                    Residue::cType[i][j] = strVec[tmpInt++];
                    Residue::vdwType[i][j] = atoi(strVec[tmpInt++].c_str());
                    tmpStr = Name1[i];
                    tmpStr += Residue::cType[i][j];
                    Residue::AtomMap.insert(SIMAP::value_type(tmpStr, j));
                    Residue::AtomIndexMap.insert(SIMAP::value_type(tmpStr, AtomIndex++));
                }
            }
        }
        else if (strcmp(tempCh, "atomDependency") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                if (strVec[1] != Residue::Name1[i]) {
                    cout << "atomDependency error, wrong AA type " << i << " " << strVec[1][0] << " " <<
                    Residue::Name1[i] << endl;
                    exit(0);
                }
                // read the atom dependency data for each atom
                tmpInt = 2;
                for (j = 0; j < Residue::numAtom[i]; ++j) {
                    if (strVec[tmpInt++] != Residue::cType[i][j]) {
                        cout << "atomDependency error, wrong atom type " << strVec[tmpInt] << " " <<
                        Residue::cType[i][j] << " " << i << endl;
                        exit(0);
                    }
                    // read the next three integers
                    Residue::prev_atom[i][j][0] = atoi(strVec[tmpInt++].c_str());
                    Residue::prev_atom[i][j][1] = atoi(strVec[tmpInt++].c_str());
                    Residue::prev_atom[i][j][2] = atoi(strVec[tmpInt++].c_str());
                }
            }
        }
        else if (strcmp(tempCh, "bondParameter") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                if (strVec[1] != Name1[i]) {
                    cout << "bondParameter error, wrong AA type " << i << " " << strVec[1][0] << endl;
                    exit(0);
                }
                // read the bond parameters
                tmpInt = 2;
                for (j = 0; j < numAtom[i]; ++j) {
                    if (strVec[tmpInt++] != cType[i][j]) {
                        cout << "bondParamter error, wrong atom type " << tmpInt << " " << strVec[tmpInt - 1] << " " <<
                        cType[i][j] << endl;
                        exit(0);
                    }
                    // read the next two double numbers
                    bond_length[i][j] = atof(strVec[tmpInt++].c_str());
                    bond_angle[i][j] = (PI / 180) * atof(strVec[tmpInt++].c_str());
                }
            }
        }
        else if (strcmp(tempCh, "residueSize") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                size[i] = atof(strVec[2].c_str());
                sc_size[i] = atof(strVec[4].c_str());
            }
        }
        else if (strcmp(tempCh, "torsionAngle") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                tmpInt = 2;
                for (j = 0; j < numAtom[i]; ++j) {
                    if (strVec[tmpInt++] != cType[i][j]) {
                        std::cout << "torsionAngle error, wrong atom type " << strVec[tmpInt - 1] << " " << cType[i][j] <<
                        endl;
                        exit(0);
                    }
                    if (atof(strVec[tmpInt].c_str()) == -1234) {
                        torsion[i][j] = -1234;
                        tmpInt++;
                    }
                    else
                        torsion[i][j] = (PI / 180) * atof(strVec[tmpInt++].c_str());
                }
            }
        }
        else if (strcmp(tempCh, "functionalAtoms") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                tmpInt = 2;
                for (j = 2; j < strVec.size(); ++j) {
                    tmpStr = strVec[0];
                    tmpStr = tmpStr + strVec[j];
                    siItr = AtomMap.find(tmpStr);
                    if (siItr == AtomMap.end()) {
                        cout << "atom type error in reading functional atoms! " << i << " " << j << " " << tmpStr <<
                        endl;
                        exit(0);
                    }
                    tmpInt = siItr->second;
                    funcAtom[i].push_back(tmpInt);
                }
            }
        }
        else {
            continue;
        }
    }

    // set backbone size
    bb_size = 1.93;
    // initialize functional group atoms

}